

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

bool __thiscall
cmCTestCurl::HttpRequest(cmCTestCurl *this,string *url,string *fields,string *response)

{
  cmCTest *pcVar1;
  bool bVar2;
  CURLcode CVar3;
  ostream *poVar4;
  string curlDebug;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  undefined1 local_198 [360];
  
  std::__cxx11::string::assign((char *)response);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"HttpRequest\n");
  poVar4 = std::operator<<(poVar4,"url: ");
  poVar4 = std::operator<<(poVar4,(string *)url);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"fields ");
  poVar4 = std::operator<<(poVar4,(string *)fields);
  std::operator<<(poVar4,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
               ,0xd4,curlDebug._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&curlDebug);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar2 = InitCurl(this);
  if (bVar2) {
    curl_easy_setopt(this->Curl,CURLOPT_POST,1);
    curl_easy_setopt(this->Curl,CURLOPT_POSTFIELDS,(fields->_M_dataplus)._M_p);
    curl_easy_setopt(this->Curl,CURLOPT_URL,(url->_M_dataplus)._M_p);
    curl_easy_setopt(this->Curl,CURLOPT_FOLLOWLOCATION,1);
    curl_easy_setopt(this->Curl,CURLOPT_WRITEFUNCTION,
                     anon_unknown.dwarf_24e031::curlWriteMemoryCallback);
    curl_easy_setopt(this->Curl,CURLOPT_DEBUGFUNCTION,anon_unknown.dwarf_24e031::curlDebugCallback);
    responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    curl_easy_setopt(this->Curl,CURLOPT_WRITEDATA);
    curl_easy_setopt(this->Curl,CURLOPT_DEBUGDATA,&debugData);
    curl_easy_setopt(this->Curl,CURLOPT_FAILONERROR,1);
    CVar3 = curl_easy_perform(this->Curl);
    if (responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      _cmCTestLog_msg = local_198;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&cmCTestLog_msg);
      std::__cxx11::string::operator=((string *)response,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl response: [");
      poVar4 = std::operator<<(poVar4,(string *)response);
      std::operator<<(poVar4,"]\n");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xee,curlDebug._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&curlDebug);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    if (debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      curlDebug._M_dataplus._M_p = (pointer)&curlDebug.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&curlDebug);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl debug: [");
      poVar4 = std::operator<<(poVar4,(string *)&curlDebug);
      std::operator<<(poVar4,"]\n");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xf3,local_1c8[0],false);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&curlDebug);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl res: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,CVar3);
    std::operator<<(poVar4,"\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xf5,curlDebug._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&curlDebug);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar2 = CVar3 == CURLE_OK;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&debugData.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&responseData.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"Initialization of curl failed");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xd7,curlDebug._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&curlDebug);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCTestCurl::HttpRequest(std::string const& url,
                              std::string const& fields,
                              std::string& response)
{
  response = "";
  cmCTestLog(this->CTest, DEBUG, "HttpRequest\n"
             << "url: " << url << "\n"
             << "fields " << fields << "\n");
  if(!this->InitCurl())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed");
    return false;
    }
  curl_easy_setopt(this->Curl, CURLOPT_POST, 1);
  curl_easy_setopt(this->Curl, CURLOPT_POSTFIELDS, fields.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_FOLLOWLOCATION, 1);
  //set response options
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION,
        curlDebugCallback);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, (void *)&responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, (void *)&debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  CURLcode res = ::curl_easy_perform(this->Curl);

  if ( responseData.size() > 0 )
    {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestLog(this->CTest, DEBUG, "Curl response: [" << response << "]\n");
    }
  if ( debugData.size() > 0 )
    {
    std::string curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestLog(this->CTest, DEBUG, "Curl debug: [" << curlDebug << "]\n");
    }
  cmCTestLog(this->CTest, DEBUG, "Curl res: " << res << "\n");
  return (res == 0);
}